

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Diagnostics.cpp
# Opt level: O0

Diagnostic * __thiscall slang::Diagnostic::operator<<(Diagnostic *this,real_t arg)

{
  real_t in_RDI;
  ConstantValue *in_stack_ffffffffffffff98;
  ConstantValue *__args;
  vector<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>_>_>
  *in_stack_ffffffffffffffb0;
  ConstantValue local_38;
  
  __args = &local_38;
  slang::ConstantValue::ConstantValue(in_stack_ffffffffffffff98,in_RDI);
  std::
  vector<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>_>_>
  ::emplace_back<slang::ConstantValue>(in_stack_ffffffffffffffb0,__args);
  slang::ConstantValue::~ConstantValue((ConstantValue *)0x65b6f3);
  return (Diagnostic *)in_RDI.v;
}

Assistant:

Diagnostic& Diagnostic::operator<<(real_t arg) {
    args.emplace_back(ConstantValue(arg));
    return *this;
}